

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  ImGuiDockNode *pIVar7;
  ImGuiContext *g;
  ImGuiDockNode *pIVar8;
  uint uVar9;
  float t;
  float fVar10;
  
  pIVar6 = GImGui;
  bVar5 = true;
  if (((node != (ImGuiDockNode *)0x0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (pIVar7 = node, (node->VisibleWindow->Flags & 4) == 0)) {
    do {
      pIVar8 = pIVar7;
      pIVar7 = pIVar8->ParentNode;
    } while (pIVar8->ParentNode != (ImGuiDockNode *)0x0);
    if (((pIVar8->OnlyNodeWithWindows != node) || (pIVar8->CentralNode != (ImGuiDockNode *)0x0)) &&
       ((undock_floating_node || ((pIVar8->MergedFlags & 0x400) != 0)))) {
      bVar5 = false;
    }
  }
  if ((GImGui->IO).MouseDown[0] == true) {
    fVar1 = (GImGui->IO).MouseDragThreshold;
    fVar10 = fVar1 * 1.7;
    uVar9 = -(uint)(fVar10 < 0.0);
    fVar1 = (float)(~uVar9 & (uint)fVar10 | (uint)fVar1 & uVar9);
    bVar3 = fVar1 * fVar1 <= (GImGui->IO).MouseDragMaxDistanceSqr[0];
  }
  else {
    bVar3 = false;
  }
  if (bVar3 && !bVar5) {
    DockContextQueueUndockNode(GImGui,node);
    return;
  }
  if (((bool)(bVar5 & ((GImGui->IO).MouseDownDuration[0] == 0.0 | bVar3))) &&
     (GImGui->MovingWindow != window)) {
    FocusWindow(window);
    SetActiveID(window->MoveId,window);
    bVar3 = true;
    bVar5 = true;
    pIVar6->NavDisableHighlight = true;
    IVar4.y = (pIVar6->IO).MouseClickedPos[0].y - (window->RootWindowDockTree->Pos).y;
    IVar4.x = (pIVar6->IO).MouseClickedPos[0].x - (window->RootWindowDockTree->Pos).x;
    pIVar6->ActiveIdClickOffset = IVar4;
    pIVar6->ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingNavAndKeys();
    if (((window->Flags & 4) != 0) || ((window->RootWindowDockTree->Flags & 4) != 0)) {
      bVar3 = false;
      bVar5 = false;
    }
    if (((window->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
        (pIVar2 = window->DockNodeAsHost->VisibleWindow, pIVar2 != (ImGuiWindow *)0x0)) &&
       (bVar5 = bVar3, (pIVar2->Flags & 4) != 0)) {
      bVar5 = false;
    }
    if (bVar5) {
      pIVar6->MovingWindow = window;
    }
    return;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)   // -V1051 PVS-Studio thinks node should be root_node and is wrong about that.
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
        DockContextQueueUndockNode(&g, node); // Will lead to DockNodeStartMouseMovingWindow() -> StartMouseMovingWindow() being called next frame
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
        StartMouseMovingWindow(window);
}